

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int kwsysProcessInitialize(cmsysProcess *cp)

{
  pid_t *p;
  pid_t *ppVar1;
  int *piVar2;
  kwsysProcessResults *pkVar3;
  char *pcVar4;
  fd_set *__arr;
  uint __i;
  pid_t *oldForkPIDs;
  int i;
  cmsysProcess *cp_local;
  
  for (oldForkPIDs._4_4_ = 0; oldForkPIDs._4_4_ < 3; oldForkPIDs._4_4_ = oldForkPIDs._4_4_ + 1) {
    cp->PipeReadEnds[oldForkPIDs._4_4_] = -1;
  }
  for (oldForkPIDs._4_4_ = 0; oldForkPIDs._4_4_ < 3; oldForkPIDs._4_4_ = oldForkPIDs._4_4_ + 1) {
    cp->PipeChildStd[oldForkPIDs._4_4_] = -1;
  }
  cp->SignalPipe = -1;
  cp->SelectError = 0;
  (cp->StartTime).tv_sec = -1;
  (cp->StartTime).tv_usec = -1;
  (cp->TimeoutTime).tv_sec = -1;
  (cp->TimeoutTime).tv_usec = -1;
  cp->TimeoutExpired = 0;
  cp->PipesLeft = 0;
  cp->CommandsLeft = 0;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    (cp->PipeSet).fds_bits[__arr._4_4_] = 0;
  }
  cp->State = 0;
  cp->Killed = 0;
  cp->ErrorMessage[0] = '\0';
  p = cp->ForkPIDs;
  ppVar1 = (pid_t *)malloc((long)cp->NumberOfCommands << 2);
  cp->ForkPIDs = ppVar1;
  kwsysProcessVolatileFree(p);
  if (cp->ForkPIDs == (pid_t *)0x0) {
    cp_local._4_4_ = 0;
  }
  else {
    for (oldForkPIDs._4_4_ = 0; oldForkPIDs._4_4_ < cp->NumberOfCommands;
        oldForkPIDs._4_4_ = oldForkPIDs._4_4_ + 1) {
      cp->ForkPIDs[oldForkPIDs._4_4_] = 0;
    }
    free(cp->CommandExitCodes);
    piVar2 = (int *)malloc((long)cp->NumberOfCommands << 2);
    cp->CommandExitCodes = piVar2;
    if (cp->CommandExitCodes == (int *)0x0) {
      cp_local._4_4_ = 0;
    }
    else {
      memset(cp->CommandExitCodes,0,(long)cp->NumberOfCommands << 2);
      free(cp->ProcessResults);
      pkVar3 = (kwsysProcessResults *)malloc((long)cp->NumberOfCommands * 0x414);
      cp->ProcessResults = pkVar3;
      if (cp->ProcessResults == (kwsysProcessResults *)0x0) {
        cp_local._4_4_ = 0;
      }
      else {
        memset(cp->ProcessResults,0,(long)cp->NumberOfCommands * 0x414);
        for (oldForkPIDs._4_4_ = 0; oldForkPIDs._4_4_ < cp->NumberOfCommands;
            oldForkPIDs._4_4_ = oldForkPIDs._4_4_ + 1) {
          cp->ProcessResults[oldForkPIDs._4_4_].ExitException = 0;
          cp->ProcessResults[oldForkPIDs._4_4_].State = 0;
          cp->ProcessResults[oldForkPIDs._4_4_].ExitCode = 1;
          cp->ProcessResults[oldForkPIDs._4_4_].ExitValue = 1;
          strcpy(cp->ProcessResults[oldForkPIDs._4_4_].ExitExceptionString,"No exception");
        }
        if (cp->WorkingDirectory != (char *)0x0) {
          cp->RealWorkingDirectoryLength = 0x1000;
          pcVar4 = (char *)malloc((long)cp->RealWorkingDirectoryLength);
          cp->RealWorkingDirectory = pcVar4;
          if (cp->RealWorkingDirectory == (char *)0x0) {
            return 0;
          }
        }
        cp_local._4_4_ = 1;
      }
    }
  }
  return cp_local._4_4_;
}

Assistant:

static int kwsysProcessInitialize(kwsysProcess* cp)
{
  int i;
  volatile pid_t* oldForkPIDs;
  for (i = 0; i < KWSYSPE_PIPE_COUNT; ++i) {
    cp->PipeReadEnds[i] = -1;
  }
  for (i = 0; i < 3; ++i) {
    cp->PipeChildStd[i] = -1;
  }
  cp->SignalPipe = -1;
  cp->SelectError = 0;
  cp->StartTime.tv_sec = -1;
  cp->StartTime.tv_usec = -1;
  cp->TimeoutTime.tv_sec = -1;
  cp->TimeoutTime.tv_usec = -1;
  cp->TimeoutExpired = 0;
  cp->PipesLeft = 0;
  cp->CommandsLeft = 0;
#if KWSYSPE_USE_SELECT
  FD_ZERO(&cp->PipeSet); // NOLINT(readability-isolate-declaration)
#endif
  cp->State = kwsysProcess_State_Starting;
  cp->Killed = 0;
  cp->ErrorMessage[0] = 0;

  oldForkPIDs = cp->ForkPIDs;
  cp->ForkPIDs = (volatile pid_t*)malloc(sizeof(volatile pid_t) *
                                         (size_t)(cp->NumberOfCommands));
  kwsysProcessVolatileFree(oldForkPIDs);
  if (!cp->ForkPIDs) {
    return 0;
  }
  for (i = 0; i < cp->NumberOfCommands; ++i) {
    cp->ForkPIDs[i] = 0; /* can't use memset due to volatile */
  }

  free(cp->CommandExitCodes);
  cp->CommandExitCodes =
    (int*)malloc(sizeof(int) * (size_t)(cp->NumberOfCommands));
  if (!cp->CommandExitCodes) {
    return 0;
  }
  memset(cp->CommandExitCodes, 0,
         sizeof(int) * (size_t)(cp->NumberOfCommands));

  /* Allocate process result information for each process.  */
  free(cp->ProcessResults);
  cp->ProcessResults = (kwsysProcessResults*)malloc(
    sizeof(kwsysProcessResults) * (size_t)(cp->NumberOfCommands));
  if (!cp->ProcessResults) {
    return 0;
  }
  memset(cp->ProcessResults, 0,
         sizeof(kwsysProcessResults) * (size_t)(cp->NumberOfCommands));
  for (i = 0; i < cp->NumberOfCommands; i++) {
    cp->ProcessResults[i].ExitException = kwsysProcess_Exception_None;
    cp->ProcessResults[i].State = kwsysProcess_StateByIndex_Starting;
    cp->ProcessResults[i].ExitCode = 1;
    cp->ProcessResults[i].ExitValue = 1;
    strcpy(cp->ProcessResults[i].ExitExceptionString, "No exception");
  }

  /* Allocate memory to save the real working directory.  */
  if (cp->WorkingDirectory) {
#if defined(MAXPATHLEN)
    cp->RealWorkingDirectoryLength = MAXPATHLEN;
#elif defined(PATH_MAX)
    cp->RealWorkingDirectoryLength = PATH_MAX;
#else
    cp->RealWorkingDirectoryLength = 4096;
#endif
    cp->RealWorkingDirectory =
      (char*)malloc((size_t)(cp->RealWorkingDirectoryLength));
    if (!cp->RealWorkingDirectory) {
      return 0;
    }
  }

  return 1;
}